

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O0

void AddScriptPathVar(char *scriptPartialPath)

{
  char *pcVar1;
  String local_70;
  String local_60;
  undefined1 local_50 [8];
  String scriptFullPath;
  char *s_1;
  char *s;
  String scriptDir;
  char *scriptPartialPath_local;
  
  scriptDir._8_8_ = scriptPartialPath;
  MiniScript::String::String((String *)&s);
  if ((scriptDir._8_8_ == 0) || (*(char *)scriptDir._8_8_ == '\0')) {
    pcVar1 = realpath(".",(char *)0x0);
    MiniScript::String::operator=((String *)&s,pcVar1);
    free(pcVar1);
  }
  else {
    scriptFullPath._8_8_ = realpath((char *)scriptDir._8_8_,(char *)0x0);
    MiniScript::String::String((String *)local_50,(char *)scriptFullPath._8_8_);
    free((void *)scriptFullPath._8_8_);
    MiniScript::String::String(&local_70,(String *)local_50);
    dirname((char *)&local_60);
    MiniScript::String::operator=((String *)&s,&local_60);
    MiniScript::String::~String(&local_60);
    MiniScript::String::~String(&local_70);
    MiniScript::String::~String((String *)local_50);
  }
  pcVar1 = MiniScript::String::c_str((String *)&s);
  setEnvVar("MS_SCRIPT_DIR",pcVar1);
  MiniScript::String::~String((String *)&s);
  return;
}

Assistant:

void AddScriptPathVar(const char* scriptPartialPath) {
	String scriptDir;
	if (!scriptPartialPath || scriptPartialPath[0] == 0) {
		#if WINDOWS
			char s[512];
			_fullpath(s, ".", sizeof(s));
			scriptDir = s;
		#else
			char* s = realpath(".", nullptr);
			scriptDir = s;
			free(s);
		#endif
	} else {
		#if WINDOWS
			char s[512];
			_fullpath(s, scriptPartialPath, sizeof(s));
			String scriptFullPath = s;
		#else
			char* s = realpath(scriptPartialPath, nullptr);
			String scriptFullPath(s);
			free(s);
		#endif
		scriptDir = dirname(scriptFullPath);
	}
	setEnvVar("MS_SCRIPT_DIR", scriptDir.c_str());
}